

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O2

MPP_RET vdpu383_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 *puVar7;
  byte *pbVar8;
  HalBufs bufs;
  void *__s;
  byte bVar9;
  RK_U32 RVar10;
  int iVar11;
  uint uVar12;
  RK_U32 RVar13;
  MppFrameFormat MVar14;
  RK_S32 RVar15;
  int iVar16;
  long lVar17;
  size_t sVar18;
  undefined8 *puVar19;
  uint *puVar20;
  HalBuf *pHVar21;
  ulong uVar22;
  MppBuffer *ppvVar23;
  uint uVar24;
  long lVar25;
  uint *puVar26;
  RK_S32 buf_size_1;
  uint uVar27;
  char *fmt;
  uint *puVar28;
  DXVA_PicParams_AV1 *pic_param;
  uint uVar29;
  byte *pbVar30;
  int *piVar31;
  int iVar32;
  uint uVar33;
  RK_U64 RVar34;
  uint uVar35;
  uint uVar36;
  void *pvVar37;
  long *plVar38;
  long *plVar39;
  int *piVar40;
  HalBufs *ppvVar41;
  MppBuffer buffer;
  bool bVar42;
  MppFrame mframe;
  void *local_190;
  BitputCtx_t bp;
  RK_U32 mapped_frame_width [8];
  MppBuffer mbuffer;
  uint local_58 [10];
  
  puVar7 = *(undefined8 **)((long)hal + 0x50);
  pbVar8 = (byte *)(task->dec).syntax.data;
  *(uint *)((long)puVar7 + 0x1b684) = (uint)pbVar8[0xc86];
  uVar22 = *(ulong *)((long)task + 8);
  if ((uVar22 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","parse err %d ref err %d\n","vdpu383_av1d_gen_regs",
               (ulong)((uint)(uVar22 >> 2) & 1),(ulong)((uint)uVar22 >> 3 & 1));
    return MPP_OK;
  }
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),*pbVar8 & 0x7f,SLOT_FRAME_PTR,&mframe);
  RVar10 = mpp_frame_get_thumbnail_en(mframe);
  if (RVar10 == 2) {
    uVar2 = (ushort)*(undefined4 *)(pbVar8 + 4);
    if ((ushort)*(undefined4 *)(pbVar8 + 4) < *(ushort *)(pbVar8 + 2)) {
      uVar2 = *(ushort *)(pbVar8 + 2);
    }
    if ((0x1000 < uVar2) && (puVar7[0x3d8d] == 0)) {
      lVar17 = *(long *)((long)hal + 0x50);
      bp._0_8_ = mpp_frame_get_buf_size(mframe);
      if (bp._0_8_ == 0) {
        fmt = "origin_bufs get buf size failed\n";
      }
      else {
        bufs = *(HalBufs *)(lVar17 + 0x1ec68);
        ppvVar41 = (HalBufs *)(lVar17 + 0x1ec68);
        if (bufs != (HalBufs)0x0) {
          hal_bufs_deinit(bufs);
          *ppvVar41 = (HalBufs)0x0;
        }
        hal_bufs_init(ppvVar41);
        if (*ppvVar41 != (HalBufs)0x0) {
          hal_bufs_setup(*ppvVar41,0x10,1,(size_t *)&bp);
          goto LAB_00207fbd;
        }
        fmt = "origin_bufs init fail\n";
      }
      _mpp_log_l(2,"hal_av1d_vdpu383",fmt,"vdpu383_setup_scale_origin_bufs");
    }
  }
LAB_00207fbd:
  if (*(int *)((long)hal + 0x58) != 0) {
    lVar17 = 0x10;
    for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
      if (*(int *)((long)puVar7 + lVar17) == 0) {
        (task->dec).reg_index = (RK_S32)lVar25;
        *puVar7 = *(undefined8 *)((long)puVar7 + lVar17 + 8);
        *(undefined4 *)((long)puVar7 + lVar17) = 1;
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)((long)puVar7 + lVar25 * 4 + 0x58);
        break;
      }
      lVar17 = lVar17 + 0x10;
    }
  }
  __s = (void *)*puVar7;
  memset(__s,0,0x298);
  sVar18 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar18;
  *(undefined4 *)((long)__s + 4) = 4;
  *(byte *)((long)__s + 8) = *(byte *)((long)__s + 8) & 0xee;
  *(uint *)((long)__s + 0xc) = *(uint *)((long)__s + 0xc) | 0x3ff;
  *(undefined4 *)((long)__s + 0x18) = 0x3fffff;
  *(uint *)((long)__s + 0x24) = (*(uint *)((long)__s + 0x24) & 0xfefffefe) + 1;
  *(undefined8 *)((long)__s + 0x34) = 0x3fffffffffffffdf;
  *(ulong *)((long)__s + 0x54) =
       *(ulong *)((long)__s + 0x54) & 0xfe00f000fffff006 | (ulong)DAT_00294c80;
  *(uint *)((long)__s + 0x5c) = *(uint *)((long)__s + 0x5c) & 0xf0fff0ff;
  mbuffer = (MppBuffer)0x0;
  local_190 = hal;
  mpp_set_bitput_ctx(&bp,(RK_U64 *)((long)puVar7 + 0x1e9d4),0x52);
  mpp_put_bits(&bp,(ulong)((uint)*(undefined8 *)(pbVar8 + 0x14) & 0xfff),0xc);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0xc & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1c & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0xd & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0xe & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0xf & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x11 & 1),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x52f],1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x12 & 1),1);
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x27) & 1),1);
  RVar34 = 0;
  if (pbVar8[0x531] != 0) {
    RVar34 = (ulong)(pbVar8[0x531] - 1);
  }
  mpp_put_bits(&bp,RVar34,3);
  bVar42 = true;
  if (pbVar8[0x55a] == 0) {
    bVar42 = pbVar8[0x55b] != 0;
  }
  if (pbVar8[0x56a] == 0) {
    uVar22 = (ulong)(pbVar8[0x56b] != 0);
  }
  else {
    uVar22 = 1;
  }
  if (pbVar8[0xc5c] == 0) {
    if (bVar42) {
      uVar22 = 1;
    }
    if (pbVar8[0x559] != 0) {
      uVar22 = 1;
    }
  }
  else {
    uVar22 = 0;
  }
  mpp_put_bits(&bp,uVar22,1);
  RVar34 = 0;
  uVar22 = (ulong)(*(ushort *)(pbVar8 + 0xe) - 8);
  if (*(ushort *)(pbVar8 + 0xe) < 9) {
    uVar22 = RVar34;
  }
  mpp_put_bits(&bp,uVar22,3);
  if (pbVar8[0x52d] == 0) {
    if (pbVar8[0x52c] == 1) {
      RVar34 = 1;
    }
    else {
      RVar34 = (ulong)(pbVar8[0x52b] == 1) ^ 3;
    }
  }
  mpp_put_bits(&bp,RVar34,2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x694],8);
  mpp_put_bits(&bp,(ulong)(pbVar8[0x17] & 1),1);
  bVar42 = (pbVar8[0x528] & 0xfd) == 0;
  mpp_put_bits(&bp,(ulong)bVar42,1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1e & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x13 & 1),1);
  mpp_put_bits(&bp,(ulong)(bVar42 || (*(uint *)(pbVar8 + 0x14) & 0x300000) != 0),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x530],8);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 2),0x10);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 4),0x10);
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x22) & 1),1);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0xc),5);
  mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + 0xc70),0x10);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1a & 1),1);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x19 & 1),1);
  for (lVar17 = 0x1ce; lVar17 != 0x1d5; lVar17 = lVar17 + 1) {
    RVar34 = 0xffffffff;
    if (*(int *)(pbVar8 + 0x734) != 0) {
      RVar34 = (RK_U64)*(uint *)(pbVar8 + lVar17 * 4);
    }
    mpp_put_bits(&bp,RVar34,3);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0xc64],3);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1b & 1),1);
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x26) & 1),1);
  for (lVar17 = 0x77c; lVar17 != 0xadc; lVar17 = lVar17 + 0x6c) {
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17),8);
  }
  for (lVar17 = 0x1ce; lVar17 != 0x1d5; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + (ulong)*(uint *)(pbVar8 + lVar17 * 4) * 4 + 0x754),8)
    ;
  }
  lVar25 = 0xc54;
  for (lVar17 = 0x1e9; lVar17 != 0x2a6; lVar17 = lVar17 + 0x1b) {
    if (pbVar8[0x531] == 0) {
      pbVar8[lVar25] = 0;
      bVar9 = 0;
    }
    else if ((char)pbVar8[lVar17 * 4] < '\0') {
      bVar9 = pbVar8[lVar25];
    }
    else {
      uVar27 = 1 << (pbVar8[0x531] - 1 & 0x1f);
      uVar24 = uVar27 - 1 &
               *(int *)(pbVar8 + (ulong)*(uint *)(pbVar8 + lVar25 * 4 + -0x2a18) * 0x6c + 0x77c) -
               (uint)pbVar8[0x530];
      uVar27 = uVar27 & *(int *)(pbVar8 + (ulong)*(uint *)(pbVar8 + lVar25 * 4 + -0x2a18) * 0x6c +
                                          0x77c) - (uint)pbVar8[0x530];
      bVar9 = (int)uVar27 < (int)uVar24;
      pbVar8[lVar25] = (int)uVar27 < (int)uVar24;
    }
    mpp_put_bits(&bp,(ulong)bVar9,1);
    lVar25 = lVar25 + 1;
  }
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1d & 1),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x54e],8);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x54f],7);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x550],7);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x552],7);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x551],7);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x553],7);
  mpp_put_bits(&bp,(long)(char)pbVar8[0x554],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x57c],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x57d],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x57f],1);
  if (pbVar8[0x57c] == 0) {
    RVar34 = 0;
  }
  else {
    RVar34 = 0;
    if ((pbVar8[0x52e] != 0) &&
       ((*(ushort *)(pbVar8 + 2) + 7 >> 2 & 0xfffffffe) ==
        (*(int *)(pbVar8 + 0x774) + 7U >> 2 & 0xfffffffe))) {
      RVar34 = (RK_U64)((*(ushort *)(pbVar8 + 4) + 7 >> 2 & 0xfffffffe) ==
                       (*(int *)(pbVar8 + 0x778) + 7U >> 2 & 0xfffffffe));
    }
  }
  mpp_put_bits(&bp,RVar34,1);
  for (lVar17 = 0x580; lVar17 != 0x588; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  pbVar30 = pbVar8 + 0x588;
  for (lVar17 = 0x59c; lVar17 != 0x69c; lVar17 = lVar17 + 0x20) {
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17 + -0x14),9);
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17 + -0x10),7);
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17 + -0xc),7);
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17 + -8),7);
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17 + -4),7);
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17),3);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x688],3);
  mpp_put_bits(&bp,(ulong)pbVar8[0x689],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x54c],1);
  RVar34 = (long)(1 << (pbVar8[0x54d] & 0x1f));
  if (pbVar8[0x54c] != 0) {
    RVar34 = (ulong)pbVar8[0x54d];
  }
  mpp_put_bits(&bp,RVar34,2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x53a],1);
  mpp_put_bits(&bp,(long)(1 << (pbVar8[0x53b] & 0x1f)),2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x539],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0xc5c],1);
  for (lVar17 = 0x580; lVar17 != 0x588; lVar17 = lVar17 + 1) {
    uVar24 = (uint)pbVar8[0x54e];
    if ((pbVar8[lVar17] & 1) != 0) {
      uVar24 = (uint)pbVar8[0x54e] + *(int *)pbVar30;
    }
    if (((((int)uVar24 < 1) && (pbVar8[0x54f] == 0)) && (pbVar8[0x550] == 0)) &&
       ((pbVar8[0x551] == 0 && (pbVar8[0x552] == 0)))) {
      RVar34 = (RK_U64)(pbVar8[0x553] == 0);
    }
    else {
      RVar34 = 0;
    }
    mpp_put_bits(&bp,RVar34,1);
    pbVar30 = pbVar30 + 0x20;
  }
  mpp_put_bits(&bp,(long)*(int *)(pbVar8 + 0xc60),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x555],4);
  mpp_put_bits(&bp,(ulong)pbVar8[0x556],4);
  mpp_put_bits(&bp,(ulong)pbVar8[0x557],4);
  mpp_put_bits(&bp,(ulong)pbVar8[0x532],6);
  mpp_put_bits(&bp,(ulong)pbVar8[0x533],6);
  mpp_put_bits(&bp,(ulong)pbVar8[0x534],6);
  mpp_put_bits(&bp,(ulong)pbVar8[0x535],6);
  mpp_put_bits(&bp,(ulong)pbVar8[0x536],3);
  mpp_put_bits(&bp,(ulong)pbVar8[0x537],1);
  for (lVar17 = 0x53c; lVar17 != 0x544; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(long)(char)pbVar8[lVar17],7);
  }
  for (lVar17 = 0x544; lVar17 != 0x546; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(long)(char)pbVar8[lVar17],7);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x558] + 3,3);
  mpp_put_bits(&bp,(ulong)pbVar8[0x559],2);
  for (lVar17 = 0x2ad; lVar17 != 0x2b5; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17 * 2],4);
  }
  for (lVar17 = 0x2b5; lVar17 != 0x2bd; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17 * 2],4);
  }
  for (lVar17 = 0x55b; lVar17 != 0x56b; lVar17 = lVar17 + 2) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],2);
  }
  for (lVar17 = 0x56b; lVar17 != 0x57b; lVar17 = lVar17 + 2) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],2);
  }
  uVar24 = 0;
  for (lVar17 = 0; (ulong)(pbVar8[0x52d] == 0) * 2 + 1 != lVar17; lVar17 = lVar17 + 1) {
    uVar24 = uVar24 | pbVar8[lVar17 + 0x546] != 0;
  }
  mpp_put_bits(&bp,(ulong)uVar24,1);
  for (lVar17 = 0x546; lVar17 != 0x549; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],2);
  }
  for (lVar17 = 0x549; lVar17 != 0x54b; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],2);
  }
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x23) & 7),2);
  mpp_put_bits(&bp,(ulong)(*(uint *)(pbVar8 + 0x14) >> 0x1f),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0xc84],3);
  mpp_put_bits(&bp,(ulong)pbVar8[0xc85],3);
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x20) & 1),1);
  mpp_put_bits(&bp,(ulong)(*(ushort *)(pbVar8 + 0x16) & 1),1);
  mpp_put_bits(&bp,(ulong)((uint)((ulong)*(undefined8 *)(pbVar8 + 0x14) >> 0x21) & 1),1);
  for (lVar17 = 0x7a6; lVar17 != 0xa9a; lVar17 = lVar17 + 0x6c) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],2);
  }
  pbVar30 = pbVar8 + 0x7c0;
  for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
    for (lVar25 = 0; lVar25 != 6; lVar25 = lVar25 + 1) {
      mpp_put_bits(&bp,(long)*(int *)(pbVar30 + lVar25 * 4),0x11);
    }
    pbVar30 = pbVar30 + 0x6c;
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x68c],1);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x72c),0x10);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x72e),1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x696],4);
  for (lVar17 = 0x699; lVar17 != 0x6b5; lVar17 = lVar17 + 2) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  for (lVar17 = 0x34d; lVar17 != 0x35b; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17 * 2],8);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x68e],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x697],4);
  for (lVar17 = 0x6b5; lVar17 != 0x6c9; lVar17 = lVar17 + 2) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  for (lVar17 = 0x35b; lVar17 != 0x365; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17 * 2],8);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x698],4);
  for (lVar17 = 0x6c9; lVar17 != 0x6dd; lVar17 = lVar17 + 2) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  for (lVar17 = 0x365; lVar17 != 0x36f; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17 * 2],8);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x68d],2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x68f],2);
  for (lVar17 = 0x6dd; lVar17 != 0x6f5; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  for (lVar17 = 0x6f5; lVar17 != 0x70e; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  for (lVar17 = 0x70e; lVar17 != 0x727; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)pbVar8[lVar17],8);
  }
  mpp_put_bits(&bp,(ulong)pbVar8[0x690],2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x691],2);
  mpp_put_bits(&bp,(ulong)pbVar8[0x727],8);
  mpp_put_bits(&bp,(ulong)pbVar8[0x728],8);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x730),9);
  mpp_put_bits(&bp,(ulong)pbVar8[0x729],8);
  mpp_put_bits(&bp,(ulong)pbVar8[0x72a],8);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x732),9);
  mpp_put_bits(&bp,(ulong)pbVar8[0x692],1);
  mpp_put_bits(&bp,(ulong)pbVar8[0x693],1);
  for (lVar17 = 0xadc; lVar17 != 0xc5c; lVar17 = lVar17 + 0x30) {
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17),0x10);
  }
  for (lVar17 = 0xae4; lVar17 != 0xc64; lVar17 = lVar17 + 0x30) {
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17),0x10);
  }
  for (lVar17 = 0xae0; lVar17 != 0xc60; lVar17 = lVar17 + 0x30) {
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17),0x10);
  }
  for (lVar17 = 0xaf0; lVar17 != 0xc70; lVar17 = lVar17 + 0x30) {
    mpp_put_bits(&bp,(long)*(int *)(pbVar8 + lVar17),2);
  }
  for (lVar17 = 0x798; lVar17 != 0xaf8; lVar17 = lVar17 + 0x6c) {
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -0x18),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -0x14),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -0x10),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -0xc),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -8),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17 + -4),8);
    mpp_put_bits(&bp,(ulong)*(uint *)(pbVar8 + lVar17),8);
  }
  mapped_frame_width[4] = 0;
  mapped_frame_width[5] = 0;
  mapped_frame_width[6] = 0;
  mapped_frame_width[7] = 0;
  mapped_frame_width[0] = 0;
  mapped_frame_width[1] = 0;
  mapped_frame_width[2] = 0;
  mapped_frame_width[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  for (lVar17 = 0x1ce; lVar17 != 0x1d5; lVar17 = lVar17 + 1) {
    uVar22 = (ulong)*(uint *)(pbVar8 + lVar17 * 4);
    mapped_frame_width[uVar22] = *(RK_U32 *)(pbVar8 + uVar22 * 0x30 + 0xae0);
    local_58[uVar22] = *(uint *)(pbVar8 + uVar22 * 0x30 + 0xae4);
  }
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    if ((pbVar8[0x17] & 2) == 0) {
      RVar10 = mapped_frame_width[lVar17];
      uVar24 = local_58[lVar17];
      uVar2 = *(ushort *)(pbVar8 + 2);
      uVar3 = *(ushort *)(pbVar8 + 4);
    }
    else {
      uVar2 = *(ushort *)(pbVar8 + 2);
      uVar3 = *(ushort *)(pbVar8 + 4);
      RVar10 = (RK_U32)uVar2;
      uVar24 = (uint)uVar3;
    }
    mpp_put_bits(&bp,(ulong)((uint)(uVar2 >> 1) + RVar10 * 0x4000) / (ulong)uVar2,0x10);
    mpp_put_bits(&bp,(ulong)((uint)(uVar3 >> 1) + uVar24 * 0x4000) / (ulong)uVar3,0x10);
  }
  mpp_put_bits(&bp,(ulong)(*(ushort *)(pbVar8 + 0x12) + 7 >> 3),10);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x1c),7);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x1e),7);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x20),0xc);
  mpp_put_bits(&bp,(ulong)pbVar8[0x524] + 1,3);
  mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + 0x1e) * (ulong)*(ushort *)(pbVar8 + 0x1c),0xd);
  mpp_put_bits(&bp,(ulong)pbVar8[0xc99] + (ulong)pbVar8[0xc98],0xc);
  for (lVar17 = 0x11; lVar17 != 0x51; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + lVar17 * 2),7);
  }
  for (lVar17 = 0x51; lVar17 != 0x91; lVar17 = lVar17 + 1) {
    mpp_put_bits(&bp,(ulong)*(ushort *)(pbVar8 + lVar17 * 2),10);
  }
  mpp_put_align(&bp,0x80,0);
  memcpy((void *)puVar7[10],(RK_U64 *)((long)puVar7 + 0x1e9d4),0x290);
  *(undefined4 *)((long)__s + 0xf4) = 0x29;
  *(undefined4 *)((long)__s + 0x6c) = *(undefined4 *)(puVar7 + 9);
  sVar18 = mpp_packet_get_length((task->dec).input_packet);
  pvVar37 = local_190;
  *(int *)((long)local_190 + 0x10) = (int)sVar18;
  *(uint *)((long)__s + 0xf0) = (int)sVar18 + 0x8eU & 0xffffff80;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)local_190 + 0x28),(task->dec).input,SLOT_BUFFER,&mbuffer);
  iVar11 = mpp_buffer_get_fd_with_caller(mbuffer,"vdpu383_av1d_gen_regs");
  *(int *)((long)__s + 0x60) = iVar11;
  uVar24 = *(uint *)(puVar7 + 1);
  *(uint *)((long)__s + 0xec) = uVar24 * 8 & 0x78;
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar37 + 0x48),0x80,uVar24 & 0xfffffff0);
  iVar11 = mpp_buffer_get_fd_with_caller(mbuffer,"vdpu383_av1d_gen_regs");
  *(int *)((long)__s + 0x198) = iVar11;
  iVar16 = *(int *)((long)pvVar37 + 0x58);
  lVar17 = *(long *)((long)pvVar37 + 0x50);
  uVar2 = *(ushort *)(pbVar8 + 2);
  uVar27 = ((uVar2 + 7 >> 3) * 100 + 7 >> 3) + 0x3f & 0x1fffffc0;
  *(undefined4 *)(lVar17 + 100) = 0x8c;
  *(undefined8 *)(lVar17 + 0x6c) = 0x8e00000000;
  *(uint *)(lVar17 + 0x68) = uVar27;
  *(uint *)(lVar17 + 0x78) = uVar27;
  *(uint *)(lVar17 + 0x74) = uVar27;
  uVar24 = (uVar2 + 0x3f >> 6) * 0x158 + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar17 + 0x7c) = 0x90;
  *(uint *)(lVar17 + 0x84) = uVar27 * 2;
  *(uint *)(lVar17 + 0x80) = uVar24;
  iVar11 = uVar24 + uVar27 * 2;
  *(undefined4 *)(lVar17 + 0x88) = 0x92;
  *(int *)(lVar17 + 0x90) = iVar11;
  *(uint *)(lVar17 + 0x8c) = uVar24;
  iVar11 = uVar24 + iVar11;
  uVar24 = (uVar2 + 0x1ff & 0x1fe00) * 0x24 >> 3;
  *(undefined4 *)(lVar17 + 0x94) = 0x94;
  *(int *)(lVar17 + 0x9c) = iVar11;
  *(uint *)(lVar17 + 0x98) = uVar24;
  iVar11 = iVar11 + uVar24;
  *(undefined4 *)(lVar17 + 0xa0) = 0x96;
  *(int *)(lVar17 + 0xa8) = iVar11;
  *(uint *)(lVar17 + 0xa4) = uVar24;
  iVar11 = iVar11 + uVar24;
  uVar24 = uVar2 + 0x3f & 0xffffffc0;
  iVar32 = uVar24 * 0x44;
  *(undefined4 *)(lVar17 + 0xac) = 0x98;
  *(int *)(lVar17 + 0xb4) = iVar11;
  *(int *)(lVar17 + 0xb0) = iVar32;
  iVar11 = iVar11 + iVar32;
  *(undefined4 *)(lVar17 + 0xb8) = 0x9a;
  *(int *)(lVar17 + 0xc0) = iVar11;
  *(int *)(lVar17 + 0xbc) = iVar32;
  iVar11 = iVar11 + iVar32;
  *(undefined4 *)(lVar17 + 0xc4) = 0x9c;
  *(int *)(lVar17 + 0xcc) = iVar11;
  *(int *)(lVar17 + 200) = iVar32;
  iVar11 = iVar11 + iVar32;
  uVar27 = (uVar24 * 0x7d6 >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar17 + 0xd0) = 0x9e;
  *(int *)(lVar17 + 0xd8) = iVar11;
  *(uint *)(lVar17 + 0xd4) = uVar27;
  iVar11 = uVar27 + iVar11;
  uVar24 = (uVar24 * 0xdc >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar17 + 0xdc) = 0xa0;
  *(int *)(lVar17 + 0xe4) = iVar11;
  *(uint *)(lVar17 + 0xe0) = uVar24;
  *(uint *)(lVar17 + 0xe8) = uVar24 + iVar11;
  uVar3 = *(ushort *)(pbVar8 + 4);
  uVar4 = *(ushort *)(pbVar8 + 0x1e);
  uVar5 = *(ushort *)(pbVar8 + 0x1c);
  uVar6 = *(ushort *)(pbVar8 + 0xe);
  uVar35 = (uint)((*(ulong *)(pbVar8 + 0x14) & 0x1000) == 0) << 6 | 0xffffff80;
  iVar11 = (uint)uVar4 * 0x200;
  uVar36 = ((uint)*(ulong *)(pbVar8 + 0x14) & 0x1000) >> 6;
  uVar24 = uVar2 + uVar36 + 0x3f & uVar35;
  *(undefined4 *)(lVar17 + 0x74) = 0;
  *(uint *)(lVar17 + 0x68) = ((uVar24 >> 3) * 100 >> 3) + 0x3f & 0x1fffffc0;
  *(uint *)(lVar17 + 0x80) = (uVar24 >> 6) * 0x158 + 0x3f & 0x1fffc0;
  uVar27 = 0;
  if (1 < uVar4) {
    uVar27 = ((uVar24 >> 6) * 0xac0 + iVar11 >> 3) + 0x3f & 0x1fffffc0;
  }
  uVar29 = ((uint)uVar6 + (uint)uVar6 * 2 + 6) * (uVar24 + 0x1ff & 0x3fe00);
  uVar33 = ((uint)uVar6 << 5 | 10) * uVar24;
  uVar12 = (uVar33 >> 4) + 0x3f & 0xffffffc0;
  iVar32 = uVar12 + 0x6c00;
  if (uVar24 < 0x1001) {
    iVar32 = uVar12 + 0x2000;
  }
  uVar12 = (uVar33 + iVar11 >> 3) + 0x3f & 0xffffffc0;
  *(uint *)(lVar17 + 0x8c) = uVar27;
  uVar27 = 0;
  uVar24 = uVar29 + iVar11 >> 3;
  if (uVar4 < 2) {
    uVar24 = 0;
  }
  *(uint *)(lVar17 + 0x98) = uVar29 >> 3;
  *(uint *)(lVar17 + 0xa4) = uVar24;
  *(int *)(lVar17 + 0xb0) = iVar32;
  *(int *)(lVar17 + 0xbc) = iVar32;
  if (uVar4 < 2) {
    uVar12 = 0;
  }
  *(uint *)(lVar17 + 200) = uVar12;
  if (1 < uVar5) {
    uVar27 = (((uint)uVar6 * 0x65 + 0x20) * (uVar3 + uVar36 + 0x3f & uVar35) + (uint)uVar5 * 0x200
             >> 3) + 0x3f & 0xffffffc0;
  }
  *(uint *)(lVar17 + 0xd4) = uVar27;
  for (lVar25 = 0; pvVar37 = local_190, (ulong)(iVar16 != 0) * 2 + 1 != lVar25; lVar25 = lVar25 + 1)
  {
    bp._0_8_ = *(undefined8 *)(lVar17 + 0xf0 + lVar25 * 8);
    if ((MppBuffer)bp._0_8_ != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller((MppBuffer)bp._0_8_,"vdpu383_av1d_rcb_setup");
      *(undefined8 *)(lVar17 + 0xf0 + lVar25 * 8) = 0;
    }
    mpp_buffer_get_with_tag
              (*(MppBufferGroup *)((long)local_190 + 0x38),(MppBuffer *)&bp,
               (ulong)*(uint *)(lVar17 + 0xe8),"hal_av1d_vdpu383","vdpu383_av1d_rcb_setup");
    *(undefined8 *)(lVar17 + 0xf0 + lVar25 * 8) = bp._0_8_;
  }
  puVar19 = puVar7 + 0x1e;
  if (*(int *)((long)local_190 + 0x58) != 0) {
    puVar19 = puVar19 + (task->dec).reg_index;
  }
  plVar38 = *(long **)((long)local_190 + 0x50);
  lVar17 = *plVar38;
  iVar11 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar19,"vdpu383_av1d_rcb_reg_cfg");
  *(int *)(lVar17 + 0x90) = iVar11;
  *(int *)(lVar17 + 0x98) = iVar11;
  *(int *)(lVar17 + 0xa0) = iVar11;
  *(int *)(lVar17 + 0xa8) = iVar11;
  *(int *)(lVar17 + 0xb0) = iVar11;
  *(int *)(lVar17 + 0xb8) = iVar11;
  *(int *)(lVar17 + 0xc0) = iVar11;
  *(int *)(lVar17 + 200) = iVar11;
  *(int *)(lVar17 + 0xd0) = iVar11;
  *(int *)(lVar17 + 0xd8) = iVar11;
  *(int *)(lVar17 + 0xe0) = iVar11;
  *(int *)(lVar17 + 0x94) = (int)plVar38[0xd];
  *(undefined4 *)(lVar17 + 0x9c) = *(undefined4 *)((long)plVar38 + 0x74);
  *(int *)(lVar17 + 0xa4) = (int)plVar38[0x10];
  *(undefined4 *)(lVar17 + 0xac) = *(undefined4 *)((long)plVar38 + 0x8c);
  *(int *)(lVar17 + 0xb4) = (int)plVar38[0x13];
  *(undefined4 *)(lVar17 + 0xbc) = *(undefined4 *)((long)plVar38 + 0xa4);
  *(int *)(lVar17 + 0xc4) = (int)plVar38[0x16];
  *(undefined4 *)(lVar17 + 0xcc) = *(undefined4 *)((long)plVar38 + 0xbc);
  *(int *)(lVar17 + 0xd4) = (int)plVar38[0x19];
  *(undefined4 *)(lVar17 + 0xdc) = *(undefined4 *)((long)plVar38 + 0xd4);
  *(int *)(lVar17 + 0xe4) = (int)plVar38[0x1c];
  for (lVar17 = 0x6c; lVar17 != 0xf0; lVar17 = lVar17 + 0xc) {
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)pvVar37 + 0x48),*(RK_S32 *)((long)plVar38 + lVar17 + -8),
               *(RK_U32 *)((long)plVar38 + lVar17));
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar37 + 0x20),*pbVar8 & 0x7f,SLOT_FRAME_PTR,&mframe);
  if (mframe != (MppFrame)0x0) {
    RVar10 = mpp_frame_get_hor_stride(mframe);
    RVar13 = mpp_frame_get_ver_stride(mframe);
    MVar14 = mpp_frame_get_fmt(mframe);
    if ((MVar14 & 0xf00000) == MPP_FMT_YUV420SP) {
      uVar24 = RVar13 * RVar10;
      MVar14 = mpp_frame_get_fmt(mframe);
      if ((MVar14 >> 0x19 & 1) == 0) {
        *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffffffe;
        uVar27 = RVar10 >> 4;
        *(uint *)((long)__s + 0xf8) = uVar27;
        *(uint *)((long)__s + 0xfc) = uVar27;
        uVar24 = uVar24 >> 4;
        *(uint *)((long)__s + 0x100) = uVar24;
      }
      else {
        *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) | 2;
        uVar27 = RVar10 * 6 + 0xf >> 4;
        *(uint *)((long)__s + 0xf8) = uVar27;
        uVar24 = (uVar24 >> 1) + uVar24 >> 4;
        *(uint *)((long)__s + 0x100) = uVar24;
      }
    }
    else {
      RVar10 = mpp_frame_get_fbc_hdr_stride(mframe);
      RVar13 = mpp_frame_get_height(mframe);
      *(byte *)((long)__s + 8) = *(byte *)((long)__s + 8) | 1;
      uVar27 = RVar10 >> 6;
      *(uint *)((long)__s + 0xf8) = uVar27;
      *(RK_U32 *)((long)__s + 0x1f8) = (RVar13 + 0x3f & 0x3fffffc0) * uVar27 * 4;
      uVar24 = *(uint *)((long)__s + 0x100);
    }
    *(uint *)((long)__s + 0x128) = uVar27;
    *(undefined4 *)((long)__s + 300) = *(undefined4 *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0x130) = uVar24;
  }
  for (lVar17 = 0x1ce; lVar17 != 0x1d5; lVar17 = lVar17 + 1) {
    uVar24 = *(uint *)(pbVar8 + lVar17 * 4);
    if (((pbVar8[(ulong)uVar24 * 0x6c + 0x7a4] | 0x80) != 0xff) &&
       (mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)local_190 + 0x20),
                   (int)(char)pbVar8[(ulong)uVar24 * 0x6c + 0x7a4],SLOT_FRAME_PTR,&mframe),
       mframe != (MppFrame)0x0)) {
      RVar10 = mpp_frame_get_hor_stride(mframe);
      RVar13 = mpp_frame_get_ver_stride(mframe);
      uVar27 = RVar13 * RVar10;
      MVar14 = mpp_frame_get_fmt(mframe);
      if ((MVar14 & 0xf00000) == MPP_FMT_YUV420SP) {
        MVar14 = mpp_frame_get_fmt(mframe);
        if ((MVar14 >> 0x19 & 1) != 0) {
          RVar10 = RVar10 * 6 + 0xf;
          uVar27 = uVar27 + (uVar27 >> 1);
        }
      }
      else {
        RVar10 = mpp_frame_get_fbc_hdr_stride(mframe);
        RVar10 = RVar10 >> 2;
      }
      puVar20 = (uint *)((long)__s + 0x134);
      puVar26 = (uint *)((long)__s + 0x138);
      puVar28 = (uint *)((long)__s + 0x13c);
      switch(uVar24) {
      case 0:
        break;
      case 1:
        puVar20 = (uint *)((long)__s + 0x140);
        puVar26 = (uint *)((long)__s + 0x144);
        puVar28 = (uint *)((long)__s + 0x148);
        break;
      case 2:
        puVar20 = (uint *)((long)__s + 0x14c);
        puVar26 = (uint *)((long)__s + 0x150);
        puVar28 = (uint *)((long)__s + 0x154);
        break;
      case 3:
        puVar20 = (uint *)((long)__s + 0x158);
        puVar26 = (uint *)((long)__s + 0x15c);
        puVar28 = (uint *)((long)__s + 0x160);
        break;
      case 4:
        puVar20 = (uint *)((long)__s + 0x164);
        puVar26 = (uint *)((long)__s + 0x168);
        puVar28 = (uint *)((long)__s + 0x16c);
        break;
      case 5:
        puVar20 = (uint *)((long)__s + 0x170);
        puVar26 = (uint *)((long)__s + 0x174);
        puVar28 = (uint *)((long)__s + 0x178);
        break;
      case 6:
        puVar20 = (uint *)((long)__s + 0x17c);
        puVar26 = (uint *)((long)__s + 0x180);
        puVar28 = (uint *)((long)__s + 0x184);
        break;
      case 7:
        puVar20 = (uint *)((long)__s + 0x188);
        puVar26 = (uint *)((long)__s + 0x18c);
        puVar28 = (uint *)((long)__s + 400);
        break;
      default:
        goto switchD_00209a08_default;
      }
      *puVar20 = RVar10 >> 4;
      *puVar26 = RVar10 >> 4;
      *puVar28 = uVar27 >> 4;
    }
switchD_00209a08_default:
    pvVar37 = local_190;
  }
  mapped_frame_width[0] = 0;
  mapped_frame_width[1] = 0;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar37 + 0x20),(task->dec).output,SLOT_FRAME_PTR,&mframe);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar37 + 0x20),(task->dec).output,SLOT_BUFFER,
             mapped_frame_width);
  iVar11 = mpp_buffer_get_fd_with_caller
                     ((MppBuffer)mapped_frame_width._0_8_,"vdpu383_av1d_gen_regs");
  *(int *)((long)__s + 0x194) = iVar11;
  iVar11 = mpp_buffer_get_fd_with_caller
                     ((MppBuffer)mapped_frame_width._0_8_,"vdpu383_av1d_gen_regs");
  *(int *)((long)__s + 500) = iVar11;
  for (lVar17 = 0x1ce; lVar17 != 0x1d5; lVar17 = lVar17 + 1) {
    uVar24 = *(uint *)(pbVar8 + lVar17 * 4);
    lVar25 = (ulong)uVar24 * 0x6c;
    if ((pbVar8[lVar25 + 0x7a4] | 0x80) != 0xff) {
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)local_190 + 0x20),(int)(char)pbVar8[lVar25 + 0x7a4],
                 SLOT_BUFFER,mapped_frame_width);
      if ((puVar7[0x3d8d] != 0) && (RVar10 = mpp_frame_get_thumbnail_en(mframe), RVar10 == 2)) {
        pHVar21 = hal_bufs_get_buf((HalBufs)puVar7[0x3d8d],(int)(char)pbVar8[lVar25 + 0x7a4]);
        mapped_frame_width._0_8_ = *pHVar21->buf;
      }
      if (mapped_frame_width._0_8_ != 0) {
        piVar31 = (int *)((long)__s + 0x200);
        piVar40 = (int *)((long)__s + 0x19c);
        switch(uVar24) {
        case 0:
          break;
        case 1:
          piVar31 = (int *)((long)__s + 0x204);
          piVar40 = (int *)((long)__s + 0x1a0);
          break;
        case 2:
          piVar31 = (int *)((long)__s + 0x208);
          piVar40 = (int *)((long)__s + 0x1a4);
          break;
        case 3:
          piVar31 = (int *)((long)__s + 0x20c);
          piVar40 = (int *)((long)__s + 0x1a8);
          break;
        case 4:
          piVar31 = (int *)((long)__s + 0x210);
          piVar40 = (int *)((long)__s + 0x1ac);
          break;
        case 5:
          piVar31 = (int *)((long)__s + 0x214);
          piVar40 = (int *)((long)__s + 0x1b0);
          break;
        case 6:
          piVar31 = (int *)((long)__s + 0x218);
          piVar40 = (int *)((long)__s + 0x1b4);
          break;
        case 7:
          piVar31 = (int *)((long)__s + 0x21c);
          piVar40 = (int *)((long)__s + 0x1b8);
          break;
        default:
          goto switchD_00209ce9_default;
        }
        iVar11 = mpp_buffer_get_fd_with_caller
                           ((MppBuffer)mapped_frame_width._0_8_,"vdpu383_av1d_gen_regs");
        *piVar40 = iVar11;
        iVar11 = mpp_buffer_get_fd_with_caller
                           ((MppBuffer)mapped_frame_width._0_8_,"vdpu383_av1d_gen_regs");
        *piVar31 = iVar11;
      }
    }
switchD_00209ce9_default:
  }
  lVar17 = *(long *)((long)local_190 + 0x50);
  uVar24 = (*(ushort *)(pbVar8 + 2) + 0x3f >> 2 & 0xfffffff0) *
           (*(ushort *)(pbVar8 + 4) + 0x3f & 0xffffffc0);
  bp._0_8_ = ZEXT48(uVar24);
  ppvVar41 = (HalBufs *)(lVar17 + 0x108);
  if (*(HalBufs *)(lVar17 + 0x108) != (HalBufs)0x0) {
    if (uVar24 <= *(uint *)(lVar17 + 0x114)) goto LAB_00209e36;
    hal_bufs_deinit(*(HalBufs *)(lVar17 + 0x108));
    *ppvVar41 = (HalBufs)0x0;
  }
  hal_bufs_init(ppvVar41);
  if (*ppvVar41 == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","colmv bufs init fail","vdpu383_av1d_colmv_setup");
  }
  else {
    *(uint *)(lVar17 + 0x114) = uVar24;
    RVar15 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)local_190 + 0x20));
    *(RK_S32 *)(lVar17 + 0x110) = RVar15;
    hal_bufs_setup(*(HalBufs *)(lVar17 + 0x108),RVar15,1,(size_t *)&bp);
  }
LAB_00209e36:
  pHVar21 = hal_bufs_get_buf((HalBufs)puVar7[0x21],*pbVar8 & 0x7f);
  iVar11 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_gen_regs");
  *(int *)((long)__s + 0x254) = iVar11;
  piVar31 = (int *)((long)__s + 600);
  for (lVar17 = 0x1e9; lVar17 != 0x2c1; lVar17 = lVar17 + 0x1b) {
    if ((pbVar8[lVar17 * 4] | 0x80) != 0xff) {
      pHVar21 = hal_bufs_get_buf((HalBufs)puVar7[0x21],(int)(char)pbVar8[lVar17 * 4]);
      iVar11 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_gen_regs");
      *piVar31 = iVar11;
    }
    piVar31 = piVar31 + 1;
  }
  plVar38 = *(long **)((long)local_190 + 0x50);
  if (plVar38[0x4c] == 0) {
    uVar24 = ((uint)*(ushort *)(pbVar8 + 2) * 4 + 0x1fc & 0x7fe00) *
             (*(ushort *)(pbVar8 + 4) + 0x7f >> 7) + 0x73a0;
    bp._0_8_ = ZEXT48(uVar24);
    hal_bufs_init((HalBufs *)(plVar38 + 0x4c));
    pvVar37 = local_190;
    if ((HalBufs)plVar38[0x4c] == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu383","cdf bufs init fail","vdpu383_av1d_cdf_setup");
      pvVar37 = local_190;
    }
    else {
      *(uint *)((long)plVar38 + 0x26c) = uVar24;
      RVar15 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)local_190 + 0x20));
      *(RK_S32 *)(plVar38 + 0x4d) = RVar15;
      hal_bufs_setup((HalBufs)plVar38[0x4c],RVar15,1,(size_t *)&bp);
    }
    plVar38 = *(long **)((long)pvVar37 + 0x50);
  }
  bVar9 = pbVar8[0x528];
  if (bVar9 == 0) {
    for (lVar17 = 0; lVar17 != 0x140; lVar17 = lVar17 + 0x28) {
      *(undefined4 *)((long)plVar38 + lVar17 + 0x124) = 0;
    }
  }
  bVar1 = pbVar8[0x54e];
  iVar11 = 0;
  if ((0x14 < bVar1) && (iVar11 = 1, 0x3c < bVar1)) {
    iVar11 = 3 - (uint)(bVar1 < 0x79);
  }
  lVar17 = *plVar38;
  if ((bVar9 == 0) || ((ulong)pbVar8[0x52e] == 7)) {
    iVar16 = mpp_buffer_get_fd_with_caller((MppBuffer)plVar38[0x4b],"vdpu383_av1d_set_cdf");
    *(int *)(lVar17 + 0x1d4) = iVar16;
    buffer = (MppBuffer)plVar38[0x4b];
    lVar25 = 0x1bc;
  }
  else {
    uVar22 = (ulong)*(uint *)(pbVar8 + (ulong)pbVar8[0x52e] * 4 + 0x738);
    iVar11 = (int)plVar38[uVar22 * 5 + 0x25];
    if (((pbVar8[0x17] & 0x20) == 0) && (*(int *)((long)plVar38 + uVar22 * 0x28 + 0x124) != 0)) {
      pHVar21 = hal_bufs_get_buf((HalBufs)plVar38[0x4c],(int)(char)pbVar8[uVar22 * 0x6c + 0x7a4]);
      ppvVar23 = pHVar21->buf;
    }
    else {
      ppvVar23 = (MppBuffer *)(plVar38 + 0x4b);
    }
    buffer = *ppvVar23;
    iVar16 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar17 + 0x1d4) = iVar16;
    iVar16 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar17 + 0x1bc) = iVar16;
    lVar25 = 0x1c8;
  }
  iVar16 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
  *(int *)(lVar17 + lVar25) = iVar16;
  pHVar21 = hal_bufs_get_buf((HalBufs)plVar38[0x4c],*pbVar8 & 0x7f);
  iVar16 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar17 + 0x1d8) = iVar16;
  iVar16 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar17 + 0x1c0) = iVar16;
  iVar16 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_set_cdf");
  pvVar37 = local_190;
  *(int *)(lVar17 + 0x1cc) = iVar16;
  mpp_dev_set_reg_offset(*(MppDev *)((long)local_190 + 0x48),0xb2,iVar11 * 0x1620 + 0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar37 + 0x48),0xb3,0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar37 + 0x48),0xb5,0x73a0);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar37 + 0x48),0xb6,0x73a0);
  bVar9 = pbVar8[0xc86];
  plVar39 = plVar38 + 0x25;
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    if ((bVar9 >> ((uint)lVar17 & 0x1f) & 1) != 0) {
      if ((pbVar8[0x17] & 0x20) == 0) {
        *(undefined8 *)((long)plVar39 + -4) = 1;
      }
      else if ((*(int *)(pbVar8 + 0xc78) == 0) || (pbVar8[0x528] != 0)) {
        *(int *)plVar39 = iVar11;
      }
      else {
        *(int *)plVar39 = (int)plVar38[(ulong)*(uint *)(pbVar8 + 0xc74) * 5 + 0x25];
      }
    }
    plVar39 = plVar39 + 5;
  }
  mpp_buffer_sync_end_f((MppBuffer)puVar7[8],0,"vdpu383_av1d_gen_regs");
  pvVar37 = local_190;
  bp.buflen = 0;
  bp.index = 0;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)local_190 + 0x20),*pbVar8 & 0x7f,SLOT_BUFFER,&bp);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar37 + 0x20),*pbVar8 & 0x7f,SLOT_FRAME_PTR,&mframe);
  RVar10 = mpp_frame_get_thumbnail_en(mframe);
  iVar11 = mpp_buffer_get_fd_with_caller((MppBuffer)bp._0_8_,"vdpu383_av1d_gen_regs");
  if (RVar10 == 1) {
    *(int *)((long)__s + 0x74) = iVar11;
  }
  else {
    if (RVar10 != 2) {
      *(byte *)((long)__s + 8) = *(byte *)((long)__s + 8) & 0xdf;
      return MPP_OK;
    }
    *(int *)((long)__s + 0x74) = iVar11;
    pHVar21 = hal_bufs_get_buf((HalBufs)puVar7[0x3d8d],*pbVar8 & 0x7f);
    iVar11 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"vdpu383_av1d_gen_regs");
    *(int *)((long)__s + 0x194) = iVar11;
    *(int *)((long)__s + 500) = iVar11;
    *(int *)((long)__s + 0x198) = iVar11;
  }
  vdpu383_setup_down_scale
            (mframe,*(MppDev *)((long)local_190 + 0x48),(Vdpu383CtrlReg *)((long)__s + 4),
             (void *)((long)__s + 0xe8));
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    Vdpu383Av1dRegCtx *ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    RK_U32 i = 0;
    HalBuf *origin_buf = NULL;
    MppFrame mframe;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
    if (mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY &&
        MPP_MAX(dxva->width, dxva->height) > 4096 && ctx->origin_bufs == NULL) {
        vdpu383_setup_scale_origin_bufs(p_hal, mframe);
    }

    if (p_hal->fast_mode) {
        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                ctx->offset_uncomps = ctx->uncmps_offset[i];
                break;
            }
        }
    }
    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));
    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        memset(dump_cur_dir, 0, sizeof(dump_cur_dir));
        sprintf(dump_cur_dir, "av1/Frame%04d", dump_cur_frame);
        if (access(dump_cur_dir, 0)) {
            if (mkdir(dump_cur_dir))
                mpp_err_f("error: mkdir %s\n", dump_cur_dir);
        }
        dump_cur_frame++;
    }
#endif

    /* set reg -> ctrl reg */
    {
        regs->ctrl_regs.reg8_dec_mode          = 4; // av1
        regs->ctrl_regs.reg9.fbc_e             = 0;
        regs->ctrl_regs.reg9.buf_empty_en      = 0;

        regs->ctrl_regs.reg10.strmd_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.inter_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.intra_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.transd_auto_gating_e   = 1;
        regs->ctrl_regs.reg10.recon_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.filterd_auto_gating_e  = 1;
        regs->ctrl_regs.reg10.bus_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.ctrl_auto_gating_e     = 1;
        regs->ctrl_regs.reg10.rcb_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.err_prc_auto_gating_e  = 1;

        // regs->ctrl_regs.reg11.dec_timeout_dis        = 1;

        regs->ctrl_regs.reg13_core_timeout_threshold  = 0x3fffff;

        regs->ctrl_regs.reg16.error_proc_disable     = 1;
        regs->ctrl_regs.reg16.error_spread_disable   = 0;
        regs->ctrl_regs.reg16.roi_error_ctu_cal_en   = 0;

        regs->ctrl_regs.reg20_cabac_error_en_lowbits  = 0xffffffdf;
        regs->ctrl_regs.reg21_cabac_error_en_highbits = 0x3fffffff;

        regs->ctrl_regs.reg28.axi_perf_work_e = 1;
        regs->ctrl_regs.reg28.axi_cnt_type    = 1;
        regs->ctrl_regs.reg28.rd_latency_id   = 11;

        regs->ctrl_regs.reg29.addr_align_type     = 1;
        regs->ctrl_regs.reg29.ar_cnt_id_type      = 0;
        regs->ctrl_regs.reg29.aw_cnt_id_type      = 1;
        regs->ctrl_regs.reg29.ar_count_id         = 17;
        regs->ctrl_regs.reg29.aw_count_id         = 0;
        regs->ctrl_regs.reg29.rd_band_width_mode  = 0;

        regs->ctrl_regs.reg30.axi_wr_qos = 0;
        regs->ctrl_regs.reg30.axi_rd_qos = 0;
    }

    /* set reg -> pkt data */
    {
        MppBuffer mbuffer = NULL;

        /* uncompress header data */
        prepare_uncompress_header(p_hal, dxva, (RK_U64 *)ctx->header_data, sizeof(ctx->header_data) / 8);
        memcpy((char *)ctx->bufs_ptr, (void *)ctx->header_data, sizeof(ctx->header_data));
        regs->av1d_paras.reg67_global_len = VDPU383_UNCMPS_HEADER_SIZE / 16; // 128 bit as unit
        regs->common_addr.reg131_gbl_base = ctx->bufs_fd;
        // mpp_dev_set_reg_offset(p_hal->dev, 131, ctx->offset_uncomps);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "global_cfg.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, ctx->bufs_ptr,
                              8 * regs->av1d_paras.reg67_global_len * 16, 64, 0, 0);
        }
#endif
        // input strm
        p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);
        regs->av1d_paras.reg66_stream_len = MPP_ALIGN(p_hal->strm_len + 15, 128);
        mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &mbuffer);
        regs->common_addr.reg128_strm_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_paras.reg65_strm_start_bit = (ctx->offset_uncomps & 0xf) * 8; // bit start to decode
        mpp_dev_set_reg_offset(p_hal->dev, 128, ctx->offset_uncomps & 0xfffffff0);
        /* error */
        regs->av1d_addrs.reg169_error_ref_base = mpp_buffer_get_fd(mbuffer);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "stream_in.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer)
                              + ctx->offset_uncomps,
                              8 * p_hal->strm_len, 128, 0, 0);
        }
        {
            char *cur_fname = "stream_in_no_offset.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer),
                              8 * p_hal->strm_len, 128, 0, 0);
        }
#endif
    }

    /* set reg -> rcb */
    vdpu383_av1d_rcb_setup(p_hal, dxva);
    vdpu383_av1d_rcb_reg_cfg(p_hal, p_hal->fast_mode ? ctx->rcb_bufs[task->dec.reg_index] : ctx->rcb_bufs[0]);

    /* set reg -> para (stride, len) */
    {
        RK_U32 hor_virstride = 0;
        RK_U32 ver_virstride = 0;
        RK_U32 y_virstride = 0;
        RK_U32 uv_virstride = 0;
        RK_U32 mapped_idx;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
        if (mframe) {
            hor_virstride = mpp_frame_get_hor_stride(mframe);
            ver_virstride = mpp_frame_get_ver_stride(mframe);
            y_virstride = hor_virstride * ver_virstride;
            uv_virstride = hor_virstride * ver_virstride / 2;

            if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                RK_U32 fbd_offset;
                RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
                RK_U32 h = MPP_ALIGN(mpp_frame_get_height(mframe), 64);

                regs->ctrl_regs.reg9.fbc_e = 1;
                regs->av1d_paras.reg68_hor_virstride = fbc_hdr_stride / 64;
                fbd_offset = regs->av1d_paras.reg68_hor_virstride * h * 4;
                regs->av1d_addrs.reg193_fbc_payload_offset = fbd_offset;
            } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                regs->ctrl_regs.reg9.tile_e = 1;
                regs->av1d_paras.reg68_hor_virstride = MPP_ALIGN(hor_virstride * 6, 16) >> 4;
                regs->av1d_paras.reg70_y_virstride = (y_virstride + uv_virstride) >> 4;
            } else {
                regs->ctrl_regs.reg9.fbc_e = 0;
                regs->av1d_paras.reg68_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg69_raster_uv_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg70_y_virstride = y_virstride >> 4;
            }
            /* error */
            regs->av1d_paras.reg80_error_ref_hor_virstride = regs->av1d_paras.reg68_hor_virstride;
            regs->av1d_paras.reg81_error_ref_raster_uv_hor_virstride = regs->av1d_paras.reg69_raster_uv_hor_virstride;
            regs->av1d_paras.reg82_error_ref_virstride = regs->av1d_paras.reg70_y_virstride;
        }

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; ++i) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_FRAME_PTR, &mframe);
                if (mframe) {
                    hor_virstride = mpp_frame_get_hor_stride(mframe);
                    ver_virstride = mpp_frame_get_ver_stride(mframe);
                    y_virstride = hor_virstride * ver_virstride;
                    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = mpp_frame_get_fbc_hdr_stride(mframe) / 4;
                    } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = MPP_ALIGN(hor_virstride * 6, 16);
                        y_virstride += y_virstride / 2;
                    }
                    SET_REF_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_RASTER_UV_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_VIRSTRIDE(regs->av1d_paras, mapped_idx, y_virstride >> 4);
                }
            }
        }
    }

    /* set reg -> para (ref, fbc, colmv) */
    {
        MppBuffer mbuffer = NULL;
        RK_U32 mapped_idx;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
        regs->av1d_addrs.reg168_decout_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_addrs.reg192_payload_st_cur_base = mpp_buffer_get_fd(mbuffer);
        // VDPU383_SET_BUF_PROTECT_VAL(mpp_buffer_get_ptr(mbuffer), mpp_buffer_get_size(mbuffer), 0xbb, 128);

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; i++) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_BUFFER, &mbuffer);
                if (ctx->origin_bufs && mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY) {
                    origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->frame_refs[mapped_idx].Index);
                    mbuffer = origin_buf->buf[0];
                }
                if (mbuffer) {
                    SET_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                    SET_FBC_PAYLOAD_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                }
            }
        }

        HalBuf *mv_buf = NULL;
        vdpu383_av1d_colmv_setup(p_hal, dxva);
        mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->CurrPic.Index7Bits);
        regs->av1d_addrs.reg216_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
        memset(mpp_buffer_get_ptr(mv_buf->buf[0]), 0, mpp_buffer_get_size(mv_buf->buf[0]));
#endif
        for (i = 0; i < NUM_REF_FRAMES; i++) {
            if (dxva->frame_refs[i].Index != (CHAR)0xff && dxva->frame_refs[i].Index != 0x7f) {
                mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->frame_refs[i].Index);
                regs->av1d_addrs.reg217_232_colmv_ref_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
                {
                    char *cur_fname = "colmv_ref_frame";
                    memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
                    sprintf(dump_cur_fname_path, "%s/%s%d.dat", dump_cur_dir, cur_fname, i);
                    dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mv_buf->buf[0]),
                                      8 * mpp_buffer_get_size(mv_buf->buf[0]), 64, 0, 0);
                }
#endif
            }
        }
    }

    {
        vdpu383_av1d_cdf_setup(p_hal, dxva);
        vdpu383_av1d_set_cdf(p_hal, dxva);
    }
    mpp_buffer_sync_end(ctx->bufs);

    {
        //scale down config
        MppBuffer mbuffer = NULL;
        RK_S32 fd = -1;
        MppFrameThumbnailMode thumbnail_mode;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_BUFFER, &mbuffer);
        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        thumbnail_mode = mpp_frame_get_thumbnail_en(mframe);
        fd = mpp_buffer_get_fd(mbuffer);

        switch (thumbnail_mode) {
        case MPP_FRAME_THUMBNAIL_ONLY:
            regs->common_addr.reg133_scale_down_base = fd;
            origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->CurrPic.Index7Bits);
            fd = mpp_buffer_get_fd(origin_buf->buf[0]);
            regs->av1d_addrs.reg168_decout_base = fd;
            regs->av1d_addrs.reg192_payload_st_cur_base = fd;
            regs->av1d_addrs.reg169_error_ref_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_MIXED:
            regs->common_addr.reg133_scale_down_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_NONE:
        default:
            regs->ctrl_regs.reg9.scale_down_en = 0;
            break;
        }
    }

__RETURN:
    return ret = MPP_OK;
}